

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O2

void __thiscall Rml::ElementDocument::ProcessDefaultAction(ElementDocument *this,Event *event)

{
  bool bVar1;
  int iVar2;
  CanFocus CVar3;
  Element *pEVar4;
  ComputedValues *pCVar5;
  ElementDocument *element;
  Property *property;
  NavigationSearchDirection direction;
  PropertyId id;
  ElementDocument *this_00;
  ScrollIntoViewOptions options;
  allocator<char> local_4d;
  int local_4c;
  String local_48;
  
  Element::ProcessDefaultAction(&this->super_Element,event);
  bVar1 = Event::operator==(event,Keydown);
  if (!bVar1) {
    return;
  }
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"key_identifier",&local_4d);
  local_4c = 0;
  iVar2 = Get<int>(&event->parameters,&local_48,&local_4c);
  ::std::__cxx11::string::~string((string *)&local_48);
  switch(iVar2) {
  case 0x5a:
    direction = Left;
    id = NavLeft;
    break;
  case 0x5b:
    direction = Up;
    id = NavUp;
    break;
  case 0x5c:
    direction = Right;
    id = NavRight;
    break;
  case 0x5d:
    direction = Down;
    id = NavDown;
    break;
  default:
    if (((iVar2 != 1) && (iVar2 != 0x3d)) && (iVar2 != 0x48)) {
      if (iVar2 != 0x46) {
        return;
      }
      pEVar4 = Event::GetTargetElement(event);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"shift_key",(allocator<char> *)&local_4c);
      local_4d = (allocator<char>)0x0;
      bVar1 = Get<bool>(&event->parameters,&local_48,(bool *)&local_4d);
      pEVar4 = FindNextTabElement(this,pEVar4,!bVar1);
      ::std::__cxx11::string::~string((string *)&local_48);
      if (pEVar4 == (Element *)0x0) {
        return;
      }
      goto LAB_0028dde4;
    }
    pEVar4 = Element::GetFocusLeafNode(&this->super_Element);
    if (pEVar4 == (Element *)0x0) {
      return;
    }
    pCVar5 = Element::GetComputedValues(pEVar4);
    if (((pCVar5->rare).field_0x2 & 0x80) == 0) {
      return;
    }
    Element::Click(pEVar4);
    goto LAB_0028de08;
  }
  element = (ElementDocument *)Element::GetFocusLeafNode(&this->super_Element);
  while ((this_00 = this, element != (ElementDocument *)0x0 &&
         (CVar3 = anon_unknown_0::CanFocusElement(&element->super_Element), this_00 = element,
         CVar3 != Yes))) {
    element = (ElementDocument *)Element::GetParentNode(&element->super_Element);
  }
  property = Element::GetLocalProperty(&this_00->super_Element,id);
  if ((property != (Property *)0x0) &&
     (pEVar4 = FindNextNavigationElement(this,&this_00->super_Element,direction,property),
     pEVar4 != (Element *)0x0)) {
LAB_0028dde4:
    bVar1 = Element::Focus(pEVar4,true);
    if (bVar1) {
      options.behavior = Instant;
      options.parentage = All;
      options.vertical = Nearest;
      options.horizontal = Nearest;
      Element::ScrollIntoView(pEVar4,options);
LAB_0028de08:
      Event::StopPropagation(event);
    }
  }
  return;
}

Assistant:

void ElementDocument::ProcessDefaultAction(Event& event)
{
	Element::ProcessDefaultAction(event);

	// Process generic keyboard events for this window in bubble phase
	if (event == EventId::Keydown)
	{
		int key_identifier = event.GetParameter<int>("key_identifier", Input::KI_UNKNOWN);

		// Process TAB
		if (key_identifier == Input::KI_TAB)
		{
			if (Element* element = FindNextTabElement(event.GetTargetElement(), !event.GetParameter<bool>("shift_key", false)))
			{
				if (element->Focus(true))
				{
					element->ScrollIntoView(ScrollAlignment::Nearest);
					event.StopPropagation();
				}
			}
		}
		// Process direction keys
		else if (key_identifier == Input::KI_LEFT || key_identifier == Input::KI_RIGHT || key_identifier == Input::KI_UP ||
			key_identifier == Input::KI_DOWN)
		{
			NavigationSearchDirection direction = {};
			PropertyId property_id = PropertyId::NavLeft;
			switch (key_identifier)
			{
			case Input::KI_LEFT:
				direction = NavigationSearchDirection::Left;
				property_id = PropertyId::NavLeft;
				break;
			case Input::KI_RIGHT:
				direction = NavigationSearchDirection::Right;
				property_id = PropertyId::NavRight;
				break;
			case Input::KI_UP:
				direction = NavigationSearchDirection::Up;
				property_id = PropertyId::NavUp;
				break;
			case Input::KI_DOWN:
				direction = NavigationSearchDirection::Down;
				property_id = PropertyId::NavDown;
				break;
			}

			auto GetNearestFocusable = [this](Element* focus_node) -> Element* {
				while (focus_node)
				{
					if (CanFocusElement(focus_node) == CanFocus::Yes)
						break;
					focus_node = focus_node->GetParentNode();
				}
				return focus_node ? focus_node : this;
			};
			Element* focus_node = GetNearestFocusable(GetFocusLeafNode());
			if (const Property* nav_property = focus_node->GetLocalProperty(property_id))
			{
				if (Element* next = FindNextNavigationElement(focus_node, direction, *nav_property))
				{
					if (next->Focus(true))
					{
						next->ScrollIntoView(ScrollAlignment::Nearest);
						event.StopPropagation();
					}
				}
			}
		}
		// Process ENTER being pressed on a focusable object (emulate click)
		else if (key_identifier == Input::KI_RETURN || key_identifier == Input::KI_NUMPADENTER || key_identifier == Input::KI_SPACE)
		{
			Element* focus_node = GetFocusLeafNode();

			if (focus_node && focus_node->GetComputedValues().tab_index() == Style::TabIndex::Auto)
			{
				focus_node->Click();
				event.StopPropagation();
			}
		}
	}
}